

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

bool __thiscall llvm::yaml::scanTokens(yaml *this,StringRef Input)

{
  char cVar1;
  StringRef Input_00;
  Token T;
  SourceMgr SM;
  Scanner scanner;
  Token local_200;
  SourceMgr local_1c8;
  Scanner local_188;
  
  local_1c8.DiagHandler = (DiagHandlerTy)0x0;
  local_1c8.DiagContext = (void *)0x0;
  local_1c8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.IncludeDirectories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.Buffers.
  super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  Scanner::Scanner(&local_188,Input_00,&local_1c8,true,(error_code *)0x0);
  do {
    Scanner::getNext(&local_200,&local_188);
    cVar1 = local_200.Kind == TK_Error;
    if (local_200.Kind == TK_StreamEnd) {
      cVar1 = '\x03';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.Value._M_dataplus._M_p != &local_200.Value.field_2) {
      operator_delete(local_200.Value._M_dataplus._M_p,
                      local_200.Value.field_2._M_allocated_capacity + 1);
    }
  } while (cVar1 == '\0');
  if ((SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U> *)
      local_188.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
      super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
      super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.
      BeginX != &local_188.SimpleKeys.super_SmallVectorStorage<(anonymous_namespace)::SimpleKey,_4U>
     ) {
    free(local_188.SimpleKeys.super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
         super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
         super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
         super_SmallVectorBase.BeginX);
  }
  if ((SmallVectorStorage<int,_4U> *)
      local_188.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
      super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX !=
      &local_188.Indents.super_SmallVectorStorage<int,_4U>) {
    free(local_188.Indents.super_SmallVectorImpl<int>.super_SmallVectorTemplateBase<int,_true>.
         super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
  }
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::~AllocatorList(&local_188.TokenQueue);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8.IncludeDirectories);
  std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::~vector
            (&local_1c8.Buffers);
  return cVar1 == '\x03';
}

Assistant:

bool yaml::scanTokens(StringRef Input) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}